

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallCommand.cxx
# Opt level: O1

cmInstallTargetGenerator *
CreateInstallTargetGenerator
          (cmTarget *target,cmInstallCommandArguments *args,bool impLib,
          cmListFileBacktrace *backtrace,string *destination,bool forceOpt,bool namelink)

{
  pointer pcVar1;
  char *dest;
  char *file_permissions;
  bool exclude_from_all;
  bool bVar2;
  MessageLevel MVar3;
  cmMakefile *mf;
  undefined4 extraout_var;
  string *psVar4;
  cmInstallTargetGenerator *this;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *configurations;
  cmListFileBacktrace local_70;
  string local_60;
  pointer local_40;
  undefined8 local_38;
  
  mf = cmTarget::GetMakefile(target);
  MVar3 = cmInstallGenerator::SelectMessageLevel(mf,false);
  local_38 = CONCAT44(extraout_var,MVar3);
  cmTarget::SetHaveInstallRule(target,true);
  if (namelink) {
    psVar4 = cmInstallCommandArguments::GetNamelinkComponent_abi_cxx11_(args);
  }
  else {
    psVar4 = cmInstallCommandArguments::GetComponent_abi_cxx11_(args);
  }
  local_40 = (psVar4->_M_dataplus)._M_p;
  this = (cmInstallTargetGenerator *)operator_new(0x118);
  psVar4 = cmTarget::GetName_abi_cxx11_(target);
  local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  pcVar1 = (psVar4->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_60,pcVar1,pcVar1 + psVar4->_M_string_length);
  dest = (destination->_M_dataplus)._M_p;
  psVar4 = cmInstallCommandArguments::GetPermissions_abi_cxx11_(args);
  file_permissions = (psVar4->_M_dataplus)._M_p;
  configurations = cmInstallCommandArguments::GetConfigurations_abi_cxx11_(args);
  exclude_from_all = cmInstallCommandArguments::GetExcludeFromAll(args);
  bVar2 = cmInstallCommandArguments::GetOptional(args);
  local_70.TopEntry.super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (backtrace->TopEntry).
            super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_70.TopEntry.super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi =
       (backtrace->TopEntry).
       super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
       _M_pi;
  if (local_70.TopEntry.
      super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_70.TopEntry.
       super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (local_70.TopEntry.
            super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_70.TopEntry.
       super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (local_70.TopEntry.
            super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  cmInstallTargetGenerator::cmInstallTargetGenerator
            (this,&local_60,dest,impLib,file_permissions,configurations,local_40,
             (MessageLevel)local_38,exclude_from_all,bVar2 || forceOpt,&local_70);
  if (local_70.TopEntry.
      super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_70.TopEntry.
               super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  return this;
}

Assistant:

static cmInstallTargetGenerator* CreateInstallTargetGenerator(
  cmTarget& target, const cmInstallCommandArguments& args, bool impLib,
  cmListFileBacktrace const& backtrace, const std::string& destination,
  bool forceOpt = false, bool namelink = false)
{
  cmInstallGenerator::MessageLevel message =
    cmInstallGenerator::SelectMessageLevel(target.GetMakefile());
  target.SetHaveInstallRule(true);
  const char* component = namelink ? args.GetNamelinkComponent().c_str()
                                   : args.GetComponent().c_str();
  return new cmInstallTargetGenerator(
    target.GetName(), destination.c_str(), impLib,
    args.GetPermissions().c_str(), args.GetConfigurations(), component,
    message, args.GetExcludeFromAll(), args.GetOptional() || forceOpt,
    backtrace);
}